

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriCommon.c
# Opt level: O2

wchar_t uriCompareRangeW(UriTextRangeW *a,UriTextRangeW *b)

{
  wchar_t *__s1;
  wchar_t *__s2;
  int iVar1;
  int iVar2;
  size_t __n;
  bool bVar3;
  bool bVar4;
  
  if (a == (UriTextRangeW *)0x0 || b == (UriTextRangeW *)0x0) {
    bVar4 = a != (UriTextRangeW *)0x0;
    bVar3 = b == (UriTextRangeW *)0x0;
  }
  else {
    __s1 = a->first;
    __s2 = b->first;
    if (__s2 != (wchar_t *)0x0 && __s1 != (wchar_t *)0x0) {
      __n = (long)a->afterLast - (long)__s1 >> 2;
      iVar1 = (int)((ulong)((long)b->afterLast - (long)__s2) >> 2);
      iVar2 = (int)__n;
      if (iVar1 < iVar2) {
        return L'\x01';
      }
      if (-1 < iVar2 - iVar1) {
        iVar1 = wcsncmp(__s1,__s2,__n);
        if (0 < iVar1) {
          return L'\x01';
        }
        return -(uint)(iVar1 != 0);
      }
      return L'\xffffffff';
    }
    bVar4 = __s1 != (wchar_t *)0x0;
    bVar3 = __s2 == (wchar_t *)0x0;
  }
  return (bVar4 - 1) + (uint)bVar3;
}

Assistant:

int URI_FUNC(CompareRange)(
		const URI_TYPE(TextRange) * a,
		const URI_TYPE(TextRange) * b) {
	int diff;

	/* NOTE: Both NULL means equal! */
	if ((a == NULL) || (b == NULL)) {
		return ((a == NULL) ? 0 : 1) - ((b == NULL) ? 0 : 1);
	}

	/* NOTE: Both NULL means equal! */
	if ((a->first == NULL) || (b->first == NULL)) {
		return ((a->first == NULL) ? 0 : 1) - ((b->first == NULL) ? 0 : 1);
	}

	diff = ((int)(a->afterLast - a->first) - (int)(b->afterLast - b->first));
	if (diff > 0) {
		return 1;
	} else if (diff < 0) {
		return -1;
	}

	diff = URI_STRNCMP(a->first, b->first, (a->afterLast - a->first));

	if (diff > 0) {
		return 1;
	} else if (diff < 0) {
		return -1;
	}

	return diff;
}